

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<char_const(&)[10],unsigned_short&,char_const(&)[3],kj::StringTree>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [10],unsigned_short *params_1,
          char (*params_2) [3],StringTree *params_3)

{
  char (*value) [10];
  unsigned_short *value_00;
  char (*value_01) [3];
  StringTree *pSVar1;
  CappedArray<char,_8UL> local_60;
  CappedArray<char,_8UL> local_50;
  ArrayPtr<const_char> local_40;
  NoInfer<kj::StringTree> *local_30;
  StringTree *params_local_3;
  char (*params_local_2) [3];
  unsigned_short *params_local_1;
  char (*params_local) [10];
  
  local_30 = (NoInfer<kj::StringTree> *)params_2;
  params_local_3 = (StringTree *)params_1;
  params_local_2 = (char (*) [3])params;
  params_local_1 = (unsigned_short *)this;
  params_local = (char (*) [10])__return_storage_ptr__;
  value = ::const((char (*) [10])this);
  local_40 = _::toStringTreeOrCharSequence<char_const(&)[10]>(value);
  value_00 = fwd<unsigned_short&>((unsigned_short *)params_local_2);
  local_50 = _::toStringTreeOrCharSequence<unsigned_short&>(value_00);
  value_01 = ::const((char (*) [3])params_local_3);
  local_60 = (CappedArray<char,_8UL>)_::toStringTreeOrCharSequence<char_const(&)[3]>(value_01);
  pSVar1 = fwd<kj::StringTree>(local_30);
  pSVar1 = _::toStringTreeOrCharSequence(pSVar1);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>,kj::StringTree>
            (__return_storage_ptr__,(StringTree *)&local_40,(ArrayPtr<const_char> *)&local_50,
             &local_60,(ArrayPtr<const_char> *)pSVar1,params_3);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}